

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CellTypeDirector.cpp
# Opt level: O1

void __thiscall CellTypeDirector::makeForestCell(CellTypeDirector *this)

{
  element_type *peVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar2;
  RandomGenerator *pRVar3;
  Config *pCVar4;
  pair<int,_int> pVar5;
  undefined8 extraout_RDX;
  
  peVar1 = (this->builderPtr).
           super___shared_ptr<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_AbstractCellTypeBuilder[2])(peVar1,2);
  peVar1 = (this->builderPtr).
           super___shared_ptr<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_AbstractCellTypeBuilder[3])(peVar1,1);
  peVar1 = (this->builderPtr).
           super___shared_ptr<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pRVar3 = RandomGenerator::getInstance();
  pCVar4 = Config::getInstance();
  pVar5 = Config::getForestWaterLevel(pCVar4);
  uVar2 = RandomGenerator::randNormalInt(pRVar3,pVar5);
  (*peVar1->_vptr_AbstractCellTypeBuilder[5])(peVar1,(ulong)uVar2);
  peVar1 = (this->builderPtr).
           super___shared_ptr<AbstractCellTypeBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pRVar3 = RandomGenerator::getInstance();
  pCVar4 = Config::getInstance();
  pVar5 = Config::getForestPlantsCount(pCVar4);
  uVar2 = RandomGenerator::randNormalInt(pRVar3,pVar5);
  UNRECOVERED_JUMPTABLE = peVar1->_vptr_AbstractCellTypeBuilder[4];
  (*UNRECOVERED_JUMPTABLE)(peVar1,(ulong)uVar2,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void CellTypeDirector::makeForestCell() {
  builderPtr -> setType(CellType::cellType::FOREST);
  builderPtr -> setClimate(CellType::climateType::TEMPERATE);
  builderPtr -> setWaterLevel(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getForestWaterLevel()));
  builderPtr -> setPlantFood(RandomGenerator::getInstance().randNormalInt(Config::getInstance().getForestPlantsCount()));
}